

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_equalsCString_nullptr_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char **ppcVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *local_68;
  char *local_60;
  char *local_58;
  code *pcStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.buffer = (char *)0x0;
  string.size = 0;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  pcStack_50 = (code *)0x147cd2;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *string.buffer = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  pcStack_50 = (code *)0x147cff;
  bVar1 = AString_equalsCString(&string,(char *)0x0);
  if (bVar1 != false) {
    pcVar3 = "Assertion \'!AString_equalsCString(&string, ((void*)0))\' failed";
    iVar5 = 0x8b3;
    goto LAB_00148017;
  }
  pcStack_50 = (code *)0x147d18;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b3);
  if (string.capacity != 8) {
    pcStack_50 = (code *)0x0;
    local_58 = (char *)0x8;
    local_60 = "(8)";
    local_68 = (char *)string.capacity;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b4,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity");
  }
  pcStack_50 = (code *)0x147d38;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b4);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar2 = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string).buffer != NULL";
    pcVar7 = "(void*) (string).buffer";
  }
  else {
    pcStack_50 = (code *)0x147d55;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8b4);
    if (string.buffer == (char *)0x0) {
      pcVar3 = "(null)";
      pcVar2 = "";
LAB_00147ed8:
      pcStack_50 = (code *)0x0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8b4,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"\")","(string).buffer",pcVar2,pcVar3,pcVar2,"(\"\")")
      ;
    }
    if (*string.buffer != '\0') {
      pcVar2 = "\"";
      pcVar3 = string.buffer;
      goto LAB_00147ed8;
    }
    pcStack_50 = (code *)0x147d85;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8b4);
    if (string.size == 0) {
      pcStack_50 = (code *)0x147da4;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b4);
      if (private_ACUtilsTest_AString_reallocCount == 0) {
        pcStack_50 = (code *)0x147dc5;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8b5);
        pcStack_50 = (code *)0x147dd3;
        bVar1 = AString_equalsCString((AString *)0x0,"");
        if (bVar1 == false) {
          pcStack_50 = (code *)0x147dec;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b6);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar4 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount";
            iVar5 = 0x8b7;
            goto LAB_00148004;
          }
          pcStack_50 = (code *)0x147e0d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b7);
          pcStack_50 = (code *)0x147e16;
          bVar1 = AString_equalsCString((AString *)0x0,(char *)0x0);
          if (bVar1 != false) {
            pcStack_50 = (code *)0x147e2f;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8b8);
            pcStack_50 = (code *)0x147e38;
            (*string.deallocator)(string.buffer);
            return;
          }
          pcVar3 = "Assertion \'AString_equalsCString(((void*)0), ((void*)0))\' failed";
          iVar5 = 0x8b8;
        }
        else {
          pcVar3 = "Assertion \'!AString_equalsCString(((void*)0), \"\")\' failed";
          iVar5 = 0x8b6;
        }
LAB_00148017:
        pcStack_50 = test_AString_compare_equals_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,iVar5,pcVar3,0,0);
      }
      ppcVar4 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar7 = "private_ACUtilsTest_AString_reallocCount";
      iVar5 = 0x8b5;
      goto LAB_00148004;
    }
    ppcVar4 = &local_68;
    local_60 = "strlen(\"\")";
    local_68 = (char *)string.size;
    pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = "(string).size == strlen(\"\")";
    pcVar7 = "(string).size";
  }
  iVar5 = 0x8b4;
LAB_00148004:
  pcStack_50 = (code *)0x0;
  local_58 = (char *)0x0;
  *(undefined8 *)((long)ppcVar4 + -8) = 0x14800b;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar5,pcVar2,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_equalsCString_nullptr)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(&string, nullptr));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(nullptr, ""));
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_equalsCString(nullptr, nullptr));
    private_ACUtilsTest_AString_destructTestString(string);
}